

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O2

CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
          (CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *other)

{
  Matrix<double,__1,__1,_0,__1,__1> *xpr;
  long lVar1;
  long lVar2;
  uint __line;
  long lVar3;
  char *__assertion;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> BStack_48;
  
  xpr = *(Matrix<double,__1,__1,_0,__1,__1> **)this;
  lVar3 = *(long *)(this + 0x10);
  lVar1 = (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (lVar3 == lVar1) {
    lVar3 = *(long *)(this + 8);
    lVar2 = *(long *)(this + 0x18);
    *(long *)(this + 8) = lVar3 + lVar2;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 1;
    if ((xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows <=
        lVar3 + lVar2) {
      __assertion = 
      "m_row+m_currentBlockRows<=m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
      ;
      __line = 0x5d;
      goto LAB_0013acc7;
    }
    lVar3 = 0;
  }
  if (lVar1 < lVar3 + 3) {
    __assertion = 
    "(m_col + other.cols() <= m_xpr.cols()) && \"Too many coefficients passed to comma initializer (operator<<)\""
    ;
    __line = 0x60;
  }
  else {
    if (*(long *)(this + 0x18) == 1) {
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>::Block
                (&BStack_48,xpr,*(Index *)(this + 8),lVar3,1,3);
      internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                (&BStack_48,(Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 3;
      return (CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
    }
    __assertion = "m_currentBlockRows==other.rows()";
    __line = 0x61;
  }
LAB_0013acc7:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                ,__line,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 1>>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const DenseBase<OtherDerived>& other)
  {
    if (m_col==m_xpr.cols() && (other.cols()!=0 || other.rows()!=m_currentBlockRows))
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = other.rows();
      eigen_assert(m_row+m_currentBlockRows<=m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert((m_col + other.cols() <= m_xpr.cols())
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==other.rows());
    m_xpr.template block<OtherDerived::RowsAtCompileTime, OtherDerived::ColsAtCompileTime>
                    (m_row, m_col, other.rows(), other.cols()) = other;
    m_col += other.cols();
    return *this;
  }